

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O1

int Dar_CutFilter(Aig_Obj_t *pObj,Dar_Cut_t *pCut)

{
  uint uVar1;
  uint uVar2;
  Dar_Cut_t *pDVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((pCut->field_0x7 & 0x10) == 0) {
    __assert_fail("pCut->fUsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                  ,0xdd,"int Dar_CutFilter(Aig_Obj_t *, Dar_Cut_t *)");
  }
  if (pObj->field_0x1f != '\0') {
    pDVar3 = (Dar_Cut_t *)(pObj->field_5).pData;
    uVar4 = 0;
    do {
      uVar1 = *(uint *)&pDVar3->field_0x4;
      if (pDVar3 != pCut && (uVar1 >> 0x1c & 1) != 0) {
        uVar7 = uVar1 >> 0x1d;
        uVar2 = *(uint *)&pCut->field_0x4;
        uVar5 = uVar2 >> 0x1d;
        uVar6 = pCut->uSign & pDVar3->uSign;
        if (uVar5 < uVar7) {
          if (uVar6 == pCut->uSign) {
            if ((uVar2 >> 0x1c & 1) == 0) goto LAB_004edc1c;
            if (0x1fffffff < uVar2) {
              uVar8 = 0;
              do {
                uVar9 = 0;
                if (0x1fffffff < uVar1) {
                  uVar9 = 0;
                  do {
                    if (pCut->pLeaves[uVar8] == pDVar3->pLeaves[uVar9]) goto LAB_004edb95;
                    uVar9 = uVar9 + 1;
                  } while (uVar7 != uVar9);
                  uVar9 = (ulong)uVar7;
                }
LAB_004edb95:
                if ((uint)uVar9 == uVar7) goto LAB_004edb23;
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar5);
            }
            *(uint *)&pDVar3->field_0x4 = uVar1 & 0xefffffff;
          }
        }
        else if (uVar6 == pDVar3->uSign) {
          if ((uVar2 >> 0x1c & 1) != 0) {
            if (uVar1 < 0x20000000) {
LAB_004edc05:
              *(uint *)&pCut->field_0x4 = uVar2 & 0xefffffff;
              return 1;
            }
            uVar8 = 0;
            do {
              uVar9 = 0;
              if (0x1fffffff < uVar2) {
                uVar9 = 0;
                do {
                  if (pDVar3->pLeaves[uVar8] == pCut->pLeaves[uVar9]) goto LAB_004edbf5;
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
                uVar9 = (ulong)uVar5;
              }
LAB_004edbf5:
              if ((uint)uVar9 == uVar5) goto LAB_004edb23;
              uVar8 = uVar8 + 1;
              if (uVar8 == uVar7) goto LAB_004edc05;
            } while( true );
          }
LAB_004edc1c:
          __assert_fail("pDom->fUsed && pCut->fUsed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                        ,0xc1,"int Dar_CutCheckDominance(Dar_Cut_t *, Dar_Cut_t *)");
        }
      }
LAB_004edb23:
      uVar4 = uVar4 + 1;
      pDVar3 = pDVar3 + 1;
    } while (uVar4 < (byte)pObj->field_0x1f);
  }
  return 0;
}

Assistant:

static inline int Dar_CutFilter( Aig_Obj_t * pObj, Dar_Cut_t * pCut )
{ 
    Dar_Cut_t * pTemp;
    int i;
    assert( pCut->fUsed );
    // go through the cuts of the node
    Dar_ObjForEachCut( pObj, pTemp, i )
    {
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->fUsed = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given cut
                pCut->fUsed = 0;
                return 1;
            }
        }
    }
    return 0;
}